

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int MemHashCursorDelete(unqlite_kv_cursor *pCursor)

{
  unqlite_kv_io *puVar1;
  mem_hash_record *pNext;
  mem_hash_cursor *pMem;
  unqlite_kv_cursor *pCursor_local;
  
  if (pCursor[1].pStore == (unqlite_kv_engine *)0x0) {
    pCursor_local._4_4_ = -6;
  }
  else {
    puVar1 = pCursor[1].pStore[7].pIo;
    MemHashUnlinkRecord((mem_hash_kv_engine *)(pCursor[1].pStore)->pIo,
                        (mem_hash_record *)pCursor[1].pStore);
    pCursor[1].pStore = (unqlite_kv_engine *)puVar1;
    pCursor_local._4_4_ = 0;
  }
  return pCursor_local._4_4_;
}

Assistant:

static int MemHashCursorDelete(unqlite_kv_cursor *pCursor)
{
	mem_hash_cursor *pMem = (mem_hash_cursor *)pCursor;
	mem_hash_record *pNext;
	if( pMem->pCur == 0 ){
		/* Cursor does not point to anything */
		return UNQLITE_NOTFOUND;
	}
	pNext = pMem->pCur->pPrev;
	/* Perform the deletion */
	MemHashUnlinkRecord(pMem->pCur->pEngine,pMem->pCur);
	/* Point to the next entry */
	pMem->pCur = pNext;
	return UNQLITE_OK;
}